

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O2

uint32_t helper_shadd8_arm(uint32_t a,uint32_t b)

{
  return (((int)b >> 0x18) + ((int)a >> 0x18) & 0xfffffffeU) << 0x17 |
         ((int)(char)(b >> 8) + (int)(char)(a >> 8) & 0x1feU) << 7 |
         (uint)((int)(char)b + (int)(char)a) >> 1 & 0xff |
         ((int)(char)(b >> 0x10) + (int)(char)(a >> 0x10) & 0x1feU) << 0xf;
}

Assistant:

uint32_t HELPER(glue(PFX,add8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD8(a, b, 0);
    ADD8(a >> 8, b >> 8, 1);
    ADD8(a >> 16, b >> 16, 2);
    ADD8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}